

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

char * quicly_escape_unsafe_string(char *buf,void *bytes,size_t len)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  
  pcVar2 = buf;
  if (len != 0) {
    sVar3 = 0;
    do {
      bVar1 = *(byte *)((long)bytes + sVar3);
      if (((char)bVar1 < ' ') ||
         (((bVar1 - 0x22 < 0x3b && ((0x400000000000021U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) != 0)
           ) || (bVar1 == 0x7f)))) {
        ((byte *)buf)[0] = 0x5c;
        ((byte *)buf)[1] = 0x78;
        bVar1 = *(byte *)((long)bytes + sVar3);
        ((byte *)buf)[2] = "0123456789abcdef"[bVar1 >> 4];
        ((byte *)buf)[3] = "0123456789abcdef"[bVar1 & 0xf];
        buf = (char *)((byte *)buf + 4);
      }
      else {
        *buf = bVar1;
        buf = (char *)((byte *)buf + 1);
      }
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
  }
  *buf = 0;
  return pcVar2;
}

Assistant:

char *quicly_escape_unsafe_string(char *buf, const void *bytes, size_t len)
{
    char *dst = buf;
    const char *src = bytes, *end = src + len;

    for (; src != end; ++src) {
        if ((0x20 <= *src && *src <= 0x7e) && !(*src == '"' || *src == '\'' || *src == '\\')) {
            *dst++ = *src;
        } else {
            *dst++ = '\\';
            *dst++ = 'x';
            quicly_byte_to_hex(dst, (uint8_t)*src);
            dst += 2;
        }
    }
    *dst = '\0';

    return buf;
}